

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_indexer_impl.h
# Opt level: O3

void node::
     index_tree<node::TreeIndexAll,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
               (TreeIndexAll *ti,Node<label::StringLabel> *n,LabelDictionary<label::StringLabel> *ld
               ,UnitCostModelLD<label::StringLabel> *cm)

{
  uint uVar1;
  uint uVar2;
  pointer piVar3;
  pointer piVar4;
  ulong *puVar5;
  pointer plVar6;
  pointer plVar7;
  pointer pdVar8;
  pointer pdVar9;
  iterator __position;
  PreLToSize *prel_to_size;
  int iVar10;
  uint *puVar11;
  uint *puVar12;
  ulong *puVar13;
  size_type __new_size;
  int ts;
  PostLToKRAncestor *local_b0;
  PostLToLCh *local_a8;
  vector<int,_std::allocator<int>_> *local_a0;
  PreToLn *local_98;
  PostRToRLD *local_90;
  PreLToChildren *local_88;
  Node<label::StringLabel> *local_80;
  PostRToPreL *local_78;
  LabelDictionary<label::StringLabel> *local_70;
  UnitCostModelLD<label::StringLabel> *local_68;
  PreRToPreL *local_60;
  PreLToPostR *local_58;
  PreLToSize *local_50;
  int fid;
  int height;
  int subtree_max_depth;
  int start_postorder;
  int start_preorder;
  
  local_80 = n;
  local_70 = ld;
  local_68 = cm;
  iVar10 = Node<label::StringLabel>::get_tree_size(n);
  (ti->super_Constants).tree_size_ = iVar10;
  __new_size = (size_type)iVar10;
  std::vector<int,_std::allocator<int>_>::resize(&(ti->super_PostLToSize).postl_to_size_,__new_size)
  ;
  local_50 = &ti->super_PreLToSize;
  std::vector<int,_std::allocator<int>_>::resize(&local_50->prel_to_size_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PostLToParent).postl_to_parent_,__new_size);
  piVar3 = (ti->super_PostLToParent).postl_to_parent_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  piVar4 = (ti->super_PostLToParent).postl_to_parent_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (piVar3 != piVar4) {
    memset(piVar3,0xff,((long)piVar4 + (-4 - (long)piVar3) & 0xfffffffffffffffcU) + 4);
  }
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PreLToParent).prel_to_parent_,__new_size);
  piVar3 = (ti->super_PreLToParent).prel_to_parent_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  piVar4 = (ti->super_PreLToParent).prel_to_parent_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (piVar3 != piVar4) {
    memset(piVar3,0xff,((long)piVar4 + (-4 - (long)piVar3) & 0xfffffffffffffffcU) + 4);
  }
  std::vector<int,_std::allocator<int>_>::resize(&(ti->super_PostLToPreL).postl_to_prel_,__new_size)
  ;
  std::vector<int,_std::allocator<int>_>::resize(&(ti->super_PreLToPostL).prel_to_postl_,__new_size)
  ;
  std::vector<int,_std::allocator<int>_>::resize(&(ti->super_PreLToPreR).prel_to_prer_,__new_size);
  local_60 = &ti->super_PreRToPreL;
  std::vector<int,_std::allocator<int>_>::resize(&local_60->prer_to_prel_,__new_size);
  local_58 = &ti->super_PreLToPostR;
  std::vector<int,_std::allocator<int>_>::resize(&local_58->prel_to_postr_,__new_size);
  local_78 = &ti->super_PostRToPreL;
  std::vector<int,_std::allocator<int>_>::resize(&local_78->postr_to_prel_,__new_size);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&(ti->super_PostLToChildren).postl_to_children_,__new_size);
  local_88 = &ti->super_PreLToChildren;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&local_88->prel_to_children_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PreLToLabelId).prel_to_label_id_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PostLToLabelId).postl_to_label_id_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&(ti->super_PostLToType).postl_to_type_,__new_size)
  ;
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PostRToLabelId).postr_to_label_id_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&(ti->super_PostLToLLD).postl_to_lld_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&(ti->super_PreLToLLD).prel_to_lld_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&(ti->super_PreLToRLD).prel_to_rld_,__new_size);
  local_90 = &ti->super_PostRToRLD;
  std::vector<int,_std::allocator<int>_>::resize(&local_90->postr_to_rld_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PostLToDepth).postl_to_depth_,__new_size);
  local_a8 = &ti->super_PostLToLCh;
  std::vector<int,_std::allocator<int>_>::resize(&local_a8->postl_to_lch_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PostLToSubtreeMaxDepth).postl_to_subtree_max_depth_,__new_size);
  local_b0 = &ti->super_PostLToKRAncestor;
  std::vector<int,_std::allocator<int>_>::resize(&local_b0->postl_to_kr_ancestor_,__new_size);
  local_98 = &ti->super_PreToLn;
  std::vector<int,_std::allocator<int>_>::resize(&local_98->prel_to_ln_,__new_size);
  local_a0 = &(ti->super_PreToLn).prer_to_ln_;
  std::vector<int,_std::allocator<int>_>::resize(local_a0,__new_size);
  std::vector<bool,_std::allocator<bool>_>::resize
            (&(ti->super_PreLToTypeLeft).prel_to_type_left_,__new_size,false);
  puVar13 = (ti->super_PreLToTypeLeft).prel_to_type_left_.super__Bvector_base<std::allocator<bool>_>
            ._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  puVar5 = (ti->super_PreLToTypeLeft).prel_to_type_left_.super__Bvector_base<std::allocator<bool>_>.
           _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar1 = *(uint *)((long)&(ti->super_PreLToTypeLeft).prel_to_type_left_.
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8);
  if (puVar13 != puVar5) {
    memset(puVar13,0,(long)puVar5 - (long)puVar13);
    puVar13 = puVar5;
  }
  if (uVar1 != 0) {
    *puVar13 = *puVar13 & ~(0xffffffffffffffffU >> (-(char)uVar1 & 0x3fU));
  }
  std::vector<bool,_std::allocator<bool>_>::resize
            (&(ti->super_PreLToTypeRight).prel_to_type_right_,__new_size,false);
  puVar13 = (ti->super_PreLToTypeRight).prel_to_type_right_.
            super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
            super__Bit_iterator_base._M_p;
  puVar5 = (ti->super_PreLToTypeRight).prel_to_type_right_.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
           super__Bit_iterator_base._M_p;
  uVar1 = *(uint *)((long)&(ti->super_PreLToTypeRight).prel_to_type_right_.
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8);
  if (puVar13 != puVar5) {
    memset(puVar13,0,(long)puVar5 - (long)puVar13);
    puVar13 = puVar5;
  }
  if (uVar1 != 0) {
    *puVar13 = *puVar13 & ~(0xffffffffffffffffU >> (-(char)uVar1 & 0x3fU));
  }
  std::vector<long_long,_std::allocator<long_long>_>::resize
            (&(ti->super_PreLToSpfCost).prel_to_cost_all_,__new_size);
  plVar6 = (ti->super_PreLToSpfCost).prel_to_cost_all_.
           super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
           ._M_start;
  plVar7 = (ti->super_PreLToSpfCost).prel_to_cost_all_.
           super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  if (plVar6 != plVar7) {
    memset(plVar6,0,((long)plVar7 + (-8 - (long)plVar6) & 0xfffffffffffffff8U) + 8);
  }
  std::vector<long_long,_std::allocator<long_long>_>::resize
            (&(ti->super_PreLToSpfCost).prel_to_cost_left_,__new_size);
  plVar6 = (ti->super_PreLToSpfCost).prel_to_cost_left_.
           super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
           ._M_start;
  plVar7 = (ti->super_PreLToSpfCost).prel_to_cost_left_.
           super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  if (plVar6 != plVar7) {
    memset(plVar6,0,((long)plVar7 + (-8 - (long)plVar6) & 0xfffffffffffffff8U) + 8);
  }
  std::vector<long_long,_std::allocator<long_long>_>::resize
            (&(ti->super_PreLToSpfCost).prel_to_cost_right_,__new_size);
  plVar6 = (ti->super_PreLToSpfCost).prel_to_cost_right_.
           super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
           ._M_start;
  plVar7 = (ti->super_PreLToSpfCost).prel_to_cost_right_.
           super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  if (plVar6 != plVar7) {
    memset(plVar6,0,((long)plVar7 + (-8 - (long)plVar6) & 0xfffffffffffffff8U) + 8);
  }
  std::vector<double,_std::allocator<double>_>::resize
            (&(ti->super_PreLToSubtreeCost).prel_to_subtree_del_cost_,__new_size);
  pdVar8 = (ti->super_PreLToSubtreeCost).prel_to_subtree_del_cost_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar9 = (ti->super_PreLToSubtreeCost).prel_to_subtree_del_cost_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pdVar8 != pdVar9) {
    memset(pdVar8,0,((long)pdVar9 + (-8 - (long)pdVar8) & 0xfffffffffffffff8U) + 8);
  }
  std::vector<double,_std::allocator<double>_>::resize
            (&(ti->super_PreLToSubtreeCost).prel_to_subtree_ins_cost_,__new_size);
  pdVar8 = (ti->super_PreLToSubtreeCost).prel_to_subtree_ins_cost_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar9 = (ti->super_PreLToSubtreeCost).prel_to_subtree_ins_cost_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pdVar8 != pdVar9) {
    memset(pdVar8,0,((long)pdVar9 + (-8 - (long)pdVar8) & 0xfffffffffffffff8U) + 8);
  }
  piVar3 = (ti->super_ListKR).list_kr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ti->super_ListKR).list_kr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar3) {
    (ti->super_ListKR).list_kr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar3;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_erase_at_end(&(ti->super_InvertedListDepthToPostL).inverted_list_depth_to_postl_,
                    (ti->super_InvertedListDepthToPostL).inverted_list_depth_to_postl_.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::
  _Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear((_Hashtable<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)&ti->super_InvertedListLabelIdToPostL);
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PostLToFavChild).postl_to_fav_child_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PostLToFavChild).postl_to_left_fav_child_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PostLToHeight).postl_to_height_,__new_size);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&(ti->super_PostLToOrderedChildSize).postl_to_ordered_child_size_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PostLToFavorableChildOrder).postl_to_favorder_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PostLToLeftSibling).postl_to_left_sibling_,__new_size);
  start_preorder = 0;
  start_postorder = 0;
  subtree_max_depth = 0;
  height = 0;
  index_tree_recursion<node::TreeIndexAll,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
            (ti,local_80,local_70,local_68,&start_preorder,&start_postorder,0,&subtree_max_depth,0,
             &height,-1,false);
  ts = iVar10 + -1;
  fid = 0;
  fav_child_processing_order<node::TreeIndexAll>(ti,&ts,&fid);
  ts = start_postorder + -1;
  __position._M_current =
       (ti->super_ListKR).list_kr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (ti->super_ListKR).list_kr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&(ti->super_ListKR).list_kr_,__position,&ts);
    puVar12 = (uint *)(ti->super_ListKR).list_kr_.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = ts;
    puVar12 = (uint *)(__position._M_current + 1);
    (ti->super_ListKR).list_kr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)puVar12;
  }
  prel_to_size = local_50;
  puVar11 = (uint *)(ti->super_ListKR).list_kr_.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
  if (puVar11 != puVar12) {
    piVar3 = (local_b0->postl_to_kr_ancestor_).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_start;
    piVar4 = (local_a8->postl_to_lch_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      uVar1 = *puVar11;
      for (uVar2 = uVar1; -1 < (int)uVar2; uVar2 = piVar4[uVar2]) {
        piVar3[uVar2] = uVar1;
      }
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar12);
  }
  fill_ln(&local_98->prel_to_ln_,local_a0,&local_50->prel_to_size_,&local_60->prer_to_prel_);
  fill_rld(&local_90->postr_to_rld_,&prel_to_size->prel_to_size_,&local_78->postr_to_prel_,
           &local_58->prel_to_postr_,&local_88->prel_to_children_);
  return;
}

Assistant:

void index_tree(TreeIndex& ti, const node::Node<Label>& n,
    label::LabelDictionary<Label>& ld, const CostModel& cm) {
  
  int tree_size = n.get_tree_size();
  ti.tree_size_ = tree_size;
  
  // Resize and clear the indexes.
  // TODO: Resizing is not enough for some vectors in case the same TreeIndex
  //       object is used for multiple trees. Old incorrect values may remain
  //       in the vectors.
  if constexpr (std::is_base_of<PostLToSize, TreeIndex>::value) {
    ti.postl_to_size_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToSize, TreeIndex>::value) {
    ti.prel_to_size_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToParent, TreeIndex>::value) {
    ti.postl_to_parent_.resize(tree_size);
    std::fill(ti.postl_to_parent_.begin(), ti.postl_to_parent_.end(), -1);
  }
  if constexpr (std::is_base_of<PreLToParent, TreeIndex>::value) {
    ti.prel_to_parent_.resize(tree_size);
    std::fill(ti.prel_to_parent_.begin(), ti.prel_to_parent_.end(), -1);
  }
  if constexpr (std::is_base_of<PostLToPreL, TreeIndex>::value) {
    ti.postl_to_prel_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToPostL, TreeIndex>::value) {
    ti.prel_to_postl_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToPreR, TreeIndex>::value) {
    ti.prel_to_prer_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreRToPreL, TreeIndex>::value) {
    ti.prer_to_prel_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToPostR, TreeIndex>::value) {
    ti.prel_to_postr_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostRToPreL, TreeIndex>::value) {
    ti.postr_to_prel_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToChildren, TreeIndex>::value) {
    ti.postl_to_children_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToChildren, TreeIndex>::value) {
    ti.prel_to_children_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToLabelId, TreeIndex>::value) {
    ti.prel_to_label_id_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToLabelId, TreeIndex>::value) {
    ti.postl_to_label_id_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToType, TreeIndex>::value) {
    ti.postl_to_type_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostRToLabelId, TreeIndex>::value) {
    ti.postr_to_label_id_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToLLD, TreeIndex>::value) {
    ti.postl_to_lld_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToLLD, TreeIndex>::value) {
    ti.prel_to_lld_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToRLD, TreeIndex>::value) {
    ti.prel_to_rld_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostRToRLD, TreeIndex>::value) {
    ti.postr_to_rld_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToDepth, TreeIndex>::value) {
    ti.postl_to_depth_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToLCh, TreeIndex>::value) {
    ti.postl_to_lch_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToSubtreeMaxDepth, TreeIndex>::value) {
    ti.postl_to_subtree_max_depth_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToKRAncestor, TreeIndex>::value) {
    ti.postl_to_kr_ancestor_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreToLn, TreeIndex>::value) {
    ti.prel_to_ln_.resize(tree_size);
    ti.prer_to_ln_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToTypeLeft, TreeIndex>::value) {
    ti.prel_to_type_left_.resize(tree_size);
    std::fill(ti.prel_to_type_left_.begin(), ti.prel_to_type_left_.end(), false);
  }
  if constexpr (std::is_base_of<PreLToTypeRight, TreeIndex>::value) {
    ti.prel_to_type_right_.resize(tree_size);
    std::fill(ti.prel_to_type_right_.begin(), ti.prel_to_type_right_.end(), false);
  }
  if constexpr (std::is_base_of<PreLToSpfCost, TreeIndex>::value) {
    ti.prel_to_cost_all_.resize(tree_size);
    std::fill(ti.prel_to_cost_all_.begin(), ti.prel_to_cost_all_.end(), 0);
    ti.prel_to_cost_left_.resize(tree_size);
    std::fill(ti.prel_to_cost_left_.begin(), ti.prel_to_cost_left_.end(), 0);
    ti.prel_to_cost_right_.resize(tree_size);
    std::fill(ti.prel_to_cost_right_.begin(), ti.prel_to_cost_right_.end(), 0);
  }
  if constexpr (std::is_base_of<PreLToSubtreeCost, TreeIndex>::value) {
    ti.prel_to_subtree_del_cost_.resize(tree_size);
    std::fill(ti.prel_to_subtree_del_cost_.begin(), ti.prel_to_subtree_del_cost_.end(), 0.0);
    ti.prel_to_subtree_ins_cost_.resize(tree_size);
    std::fill(ti.prel_to_subtree_ins_cost_.begin(), ti.prel_to_subtree_ins_cost_.end(), 0.0);
  }
  if constexpr (std::is_base_of<ListKR, TreeIndex>::value) {
    ti.list_kr_.clear();
  }
  if constexpr (std::is_base_of<InvertedListDepthToPostL, TreeIndex>::value) {
    ti.inverted_list_depth_to_postl_.clear();
  }
  if constexpr (std::is_base_of<InvertedListLabelIdToPostL, TreeIndex>::value) {
    ti.inverted_list_label_id_to_postl_.clear();
  }
  if constexpr (std::is_base_of<PostLToFavChild, TreeIndex>::value) {
    ti.postl_to_fav_child_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToFavChild, TreeIndex>::value) {
    ti.postl_to_left_fav_child_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToHeight, TreeIndex>::value) {
    ti.postl_to_height_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToOrderedChildSize, TreeIndex>::value) {
    ti.postl_to_ordered_child_size_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToFavorableChildOrder, TreeIndex>::value) {
    ti.postl_to_favorder_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToLeftSibling, TreeIndex>::value) {
    ti.postl_to_left_sibling_.resize(tree_size);
  }

  // Orders start with '0'. Are modified by the recursive traversal.
  int start_preorder = 0;
  int start_postorder = 0;
  int start_depth = 0;
  int start_height = 0;

  // Maximum input tree depth - the first reference passed to recursion.
  int subtree_max_depth = 0;
  // Initial height.
  int height = 0;
  index_tree_recursion(ti, n, ld, cm, start_preorder, start_postorder,
      start_depth, subtree_max_depth, start_height, height, -1, false);
  
  if constexpr (std::is_base_of<PostLToFavorableChildOrder, TreeIndex>::value) {
    // Compute favorable child order.
    int ts = tree_size - 1;
    int fid = 0;
    fav_child_processing_order(ti, ts, fid);
  }

  if constexpr (std::is_base_of<ListKR, TreeIndex>::value) {
    // Add root to kr - not added in the recursion.
    ti.list_kr_.push_back(start_postorder-1);
  }

  if constexpr (std::is_base_of<PostLToKRAncestor, TreeIndex>::value) {
    fill_kr_ancestors(ti.postl_to_kr_ancestor_, ti.postl_to_lch_, ti.list_kr_);
  }

  if constexpr (std::is_base_of<PreToLn, TreeIndex>::value) {
    fill_ln(ti.prel_to_ln_, ti.prer_to_ln_, ti.prel_to_size_, ti.prer_to_prel_);
  }

  if constexpr (std::is_base_of<PostRToRLD, TreeIndex>::value) {
    fill_rld(ti.postr_to_rld_, ti.prel_to_size_, ti.postr_to_prel_,
        ti.prel_to_postr_, ti.prel_to_children_);
  }
}